

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

void av1_set_mb_wiener_variance(AV1_COMP *cpi)

{
  BLOCK_SIZE bsize;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  AV1_COMP *in_RDI;
  double dVar6;
  double dVar7;
  double dVar8;
  double scaled_satd;
  int64_t sse;
  int64_t satd;
  double min_max_scale;
  double beta;
  int sb_wiener_var;
  int mi_col;
  int mi_row;
  int its_cnt;
  double sb_count;
  double sb_wiener_log;
  int norm_step;
  BLOCK_SIZE norm_block_size;
  AV1EncAllIntraMultiThreadInfo *intra_mt;
  int num_workers;
  MultiThreadInfo *mt_info;
  double sum_est_rate;
  double sum_rec_distortion;
  MB_MODE_INFO *mbmi_ptr;
  MB_MODE_INFO mbmi;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  double *in_stack_00003688;
  double *in_stack_00003690;
  AV1_COMP *in_stack_00003698;
  int iVar9;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe34;
  ThreadData_conflict *td;
  AV1_COMMON *cm_00;
  double *sum_est_rate_00;
  undefined4 in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe5c;
  AV1_COMP *in_stack_fffffffffffffe60;
  int64_t local_198;
  AV1_COMP *local_180;
  undefined8 in_stack_fffffffffffffe88;
  BLOCK_SIZE norm_block_size_00;
  AV1_COMP *in_stack_fffffffffffffe90;
  int local_164;
  int64_t in_stack_fffffffffffffeb0;
  double in_stack_fffffffffffffeb8;
  AV1_COMP *in_stack_fffffffffffffec0;
  int local_134;
  int local_130;
  int local_12c;
  double local_128;
  double local_120;
  MB_MODE_INFO *local_e8;
  undefined1 local_e0 [3];
  _Bool in_stack_ffffffffffffff23;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  aom_codec_frame_buffer_t *in_stack_ffffffffffffff90;
  aom_get_frame_buffer_cb_fn_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb0;
  
  norm_block_size_00 = (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe88 >> 0x38);
  iVar9 = (in_RDI->oxcf).border_in_pixels;
  iVar4 = (in_RDI->common).features.byte_alignment;
  td = (ThreadData_conflict *)0x0;
  cm_00 = (AV1_COMMON *)0x0;
  sum_est_rate_00 = (double *)0x0;
  uVar2 = (uint)(in_RDI->alloc_pyramid & 1);
  iVar3 = aom_realloc_frame_buffer
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff23,
                     in_stack_ffffffffffffffb0);
  local_180 = in_stack_fffffffffffffec0;
  if (iVar3 != 0) {
    aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate frame buffer")
    ;
    local_180 = in_stack_fffffffffffffec0;
  }
  av1_alloc_mb_wiener_var_pred_buf(cm_00,td);
  in_RDI->norm_wiener_variance = 0;
  memset(local_e0,0,0xb0);
  local_e8 = (MB_MODE_INFO *)local_e0;
  (in_RDI->td).mb.e_mbd.mi = &local_e8;
  (in_RDI->common).quant_params.base_qindex = (in_RDI->oxcf).rc_cfg.cq_level;
  av1_frame_init_quantizer((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe34,iVar4));
  if ((in_RDI->mt_info).num_mod_workers[0xb] < (in_RDI->mt_info).num_workers) {
    local_164 = (in_RDI->mt_info).num_mod_workers[0xb];
  }
  else {
    local_164 = (in_RDI->mt_info).num_workers;
  }
  (in_RDI->mt_info).intra_mt.intra_sync_read_ptr = av1_row_mt_sync_read_dummy;
  (in_RDI->mt_info).intra_mt.intra_sync_write_ptr = av1_row_mt_sync_write_dummy;
  if ((local_164 < 2) || (((in_RDI->oxcf).intra_mode_cfg.auto_intra_tools_off & 1U) != 0)) {
    calc_mb_wiener_var(in_stack_00003698,in_stack_00003690,in_stack_00003688);
  }
  else {
    (in_RDI->mt_info).intra_mt.intra_sync_read_ptr = av1_row_mt_sync_read;
    (in_RDI->mt_info).intra_mt.intra_sync_write_ptr = av1_row_mt_sync_write;
    av1_calc_mb_wiener_var_mt
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
               (double *)CONCAT44(in_stack_fffffffffffffe54,uVar2),sum_est_rate_00);
  }
  automatic_intra_tools_off(in_RDI,0.0,0.0);
  if ((in_RDI->oxcf).enable_rate_guide_deltaq != 0) {
    ext_rate_guided_quantization(in_stack_fffffffffffffe90);
  }
  bsize = ((in_RDI->common).seq_params)->sb_size;
  iVar5 = estimate_wiener_var_norm(in_stack_fffffffffffffe90,norm_block_size_00);
  in_RDI->norm_wiener_variance = iVar5;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  for (local_12c = 0; local_12c < 2; local_12c = local_12c + 1) {
    local_120 = 0.0;
    local_128 = 0.0;
    for (local_130 = 0; local_130 < (in_RDI->common).mi_params.mi_rows;
        local_130 = (uint)bVar1 + local_130) {
      for (local_134 = 0; local_134 < (in_RDI->common).mi_params.mi_cols;
          local_134 = (uint)bVar1 + local_134) {
        iVar4 = get_var_perceptual_ai
                          (local_180,(BLOCK_SIZE)((ulong)in_stack_fffffffffffffeb8 >> 0x38),
                           SUB84(in_stack_fffffffffffffeb8,0),
                           (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        local_180 = (AV1_COMP *)((double)in_RDI->norm_wiener_variance / (double)iVar4);
        dVar6 = get_max_scale(in_RDI,((in_RDI->common).seq_params)->sb_size,local_130,local_134);
        if (1.0 <= dVar6) {
          in_stack_fffffffffffffeb8 =
               get_max_scale(in_RDI,((in_RDI->common).seq_params)->sb_size,local_130,local_134);
        }
        else {
          in_stack_fffffffffffffeb8 = 1.0;
        }
        if (4.0 <= (double)local_180) {
          local_180 = (AV1_COMP *)0x4010000000000000;
        }
        if ((double)local_180 <= 0.25) {
          local_180 = (AV1_COMP *)0x3fd0000000000000;
        }
        if (1.0 / in_stack_fffffffffffffeb8 <= (double)local_180) {
          dVar6 = (double)in_RDI->norm_wiener_variance / (double)local_180;
          in_stack_fffffffffffffeb0 = get_satd(in_RDI,bsize,local_130,local_134);
          iVar5 = get_sse(in_RDI,bsize,local_130,local_134);
          dVar7 = (double)in_stack_fffffffffffffeb0;
          dVar8 = sqrt((double)iVar5);
          dVar6 = log((double)(int)dVar6);
          local_120 = (dVar7 / dVar8) * dVar6 + local_120;
          local_128 = dVar7 / dVar8 + local_128;
        }
      }
    }
    if (0.0 < local_128) {
      dVar6 = exp(local_120 / local_128);
      in_RDI->norm_wiener_variance = (long)dVar6;
    }
    if (in_RDI->norm_wiener_variance < 1) {
      local_198 = 1;
    }
    else {
      local_198 = in_RDI->norm_wiener_variance;
    }
    in_RDI->norm_wiener_variance = local_198;
  }
  (in_RDI->td).mb.e_mbd.mi = (MB_MODE_INFO **)0x0;
  aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffe2c,iVar9));
  av1_dealloc_mb_wiener_var_pred_buf((ThreadData_conflict *)0x1eb761);
  return;
}

Assistant:

void av1_set_mb_wiener_variance(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  if (aom_realloc_frame_buffer(
          &cm->cur_frame->buf, cm->width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          cpi->oxcf.border_in_pixels, cm->features.byte_alignment, NULL, NULL,
          NULL, cpi->alloc_pyramid, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate frame buffer");
  av1_alloc_mb_wiener_var_pred_buf(&cpi->common, &cpi->td);
  cpi->norm_wiener_variance = 0;

  MACROBLOCK *x = &cpi->td.mb;
  MACROBLOCKD *xd = &x->e_mbd;
  // xd->mi needs to be setup since it is used in av1_frame_init_quantizer.
  MB_MODE_INFO mbmi;
  memset(&mbmi, 0, sizeof(mbmi));
  MB_MODE_INFO *mbmi_ptr = &mbmi;
  xd->mi = &mbmi_ptr;
  cm->quant_params.base_qindex = cpi->oxcf.rc_cfg.cq_level;
  av1_frame_init_quantizer(cpi);

  double sum_rec_distortion = 0.0;
  double sum_est_rate = 0.0;

  MultiThreadInfo *const mt_info = &cpi->mt_info;
  const int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_AI], mt_info->num_workers);
  AV1EncAllIntraMultiThreadInfo *const intra_mt = &mt_info->intra_mt;
  intra_mt->intra_sync_read_ptr = av1_row_mt_sync_read_dummy;
  intra_mt->intra_sync_write_ptr = av1_row_mt_sync_write_dummy;
  // Calculate differential contrast for each block for the entire image.
  // TODO(chengchen): properly accumulate the distortion and rate in
  // av1_calc_mb_wiener_var_mt(). Until then, call calc_mb_wiener_var() if
  // auto_intra_tools_off is true.
  if (num_workers > 1 && !cpi->oxcf.intra_mode_cfg.auto_intra_tools_off) {
    intra_mt->intra_sync_read_ptr = av1_row_mt_sync_read;
    intra_mt->intra_sync_write_ptr = av1_row_mt_sync_write;
    av1_calc_mb_wiener_var_mt(cpi, num_workers, &sum_rec_distortion,
                              &sum_est_rate);
  } else {
    calc_mb_wiener_var(cpi, &sum_rec_distortion, &sum_est_rate);
  }

  // Determine whether to turn off several intra coding tools.
  automatic_intra_tools_off(cpi, sum_rec_distortion, sum_est_rate);

  // Read external rate distribution and use it to guide delta quantization
  if (cpi->oxcf.enable_rate_guide_deltaq) ext_rate_guided_quantization(cpi);

  const BLOCK_SIZE norm_block_size = cm->seq_params->sb_size;
  cpi->norm_wiener_variance = estimate_wiener_var_norm(cpi, norm_block_size);
  const int norm_step = mi_size_wide[norm_block_size];

  double sb_wiener_log = 0;
  double sb_count = 0;
  for (int its_cnt = 0; its_cnt < 2; ++its_cnt) {
    sb_wiener_log = 0;
    sb_count = 0;
    for (int mi_row = 0; mi_row < cm->mi_params.mi_rows; mi_row += norm_step) {
      for (int mi_col = 0; mi_col < cm->mi_params.mi_cols;
           mi_col += norm_step) {
        int sb_wiener_var =
            get_var_perceptual_ai(cpi, norm_block_size, mi_row, mi_col);

        double beta = (double)cpi->norm_wiener_variance / sb_wiener_var;
        double min_max_scale = AOMMAX(
            1.0, get_max_scale(cpi, cm->seq_params->sb_size, mi_row, mi_col));

        beta = AOMMIN(beta, 4);
        beta = AOMMAX(beta, 0.25);

        if (beta < 1 / min_max_scale) continue;

        sb_wiener_var = (int)(cpi->norm_wiener_variance / beta);

        int64_t satd = get_satd(cpi, norm_block_size, mi_row, mi_col);
        int64_t sse = get_sse(cpi, norm_block_size, mi_row, mi_col);
        double scaled_satd = (double)satd / sqrt((double)sse);
        sb_wiener_log += scaled_satd * log(sb_wiener_var);
        sb_count += scaled_satd;
      }
    }

    if (sb_count > 0)
      cpi->norm_wiener_variance = (int64_t)(exp(sb_wiener_log / sb_count));
    cpi->norm_wiener_variance = AOMMAX(1, cpi->norm_wiener_variance);
  }

  // Set the pointer to null since mbmi is only allocated inside this function.
  xd->mi = NULL;
  aom_free_frame_buffer(&cm->cur_frame->buf);
  av1_dealloc_mb_wiener_var_pred_buf(&cpi->td);
}